

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O2

l2_expr_info *
l2_eval_expr_lshift_rshift_rshift_unsigned1
          (l2_expr_info *__return_storage_ptr__,l2_scope *scope_p,l2_expr_info left_expr_info)

{
  long lVar1;
  l2_expr_info left_expr_info_00;
  boolean bVar2;
  l2_token *plVar3;
  char *pcVar4;
  int cols;
  int lines;
  char *pcVar5;
  char *pcVar6;
  l2_expr_info new_left_expr_info;
  
  bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_LSHIFT);
  lVar1 = left_expr_info.val._0_8_;
  if (bVar2 == '\0') {
    bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_RSHIFT);
    if (bVar2 == '\0') {
      bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_RSHIFT_UNSIGNED);
      if (bVar2 == '\0') {
        (__return_storage_ptr__->val).procedure.upper_scope_p =
             left_expr_info.val.procedure.upper_scope_p;
        *(long *)__return_storage_ptr__ = left_expr_info._0_8_;
        (__return_storage_ptr__->val).integer = lVar1;
        return __return_storage_ptr__;
      }
      l2_parse_token_forward();
      plVar3 = l2_parse_token_current();
      l2_eval_expr_plus_sub(&new_left_expr_info,scope_p);
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
          new_left_expr_info.val.real =
               (double)(ulong)((uint)left_expr_info.val.procedure.entry_pos >>
                              (new_left_expr_info.val.bool & 0x1fU));
          goto LAB_001089c6;
        }
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          pcVar4 = ">>>";
          goto LAB_00108c46;
        }
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          pcVar4 = ">>>";
          goto LAB_00108b7a;
        }
      }
      else {
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
            pcVar4 = ">>>";
            goto LAB_00108c91;
          }
          if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
            pcVar4 = ">>>";
            goto LAB_00108cb0;
          }
          if (new_left_expr_info.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_00108b8e;
          pcVar4 = ">>>";
          goto LAB_00108c27;
        }
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          if (new_left_expr_info.val_type != L2_EXPR_VAL_TYPE_BOOL) {
            if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
              pcVar4 = ">>>";
              goto LAB_00108c7a;
            }
            if (new_left_expr_info.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_00108b8e;
            pcVar4 = ">>>";
            goto LAB_00108b51;
          }
          pcVar4 = ">>>";
LAB_00108cc0:
          pcVar5 = "bool";
          pcVar6 = pcVar5;
          goto LAB_00108ca2;
        }
      }
    }
    else {
      l2_parse_token_forward();
      plVar3 = l2_parse_token_current();
      l2_eval_expr_plus_sub(&new_left_expr_info,scope_p);
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
          new_left_expr_info.val.integer = lVar1 >> (new_left_expr_info.val.bool & 0x3fU);
LAB_001089c6:
          new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
          left_expr_info_00._4_4_ = new_left_expr_info._4_4_;
          left_expr_info_00.val_type = 2;
          left_expr_info_00.val.integer = new_left_expr_info.val.integer;
          left_expr_info_00.val.procedure.upper_scope_p =
               new_left_expr_info.val.procedure.upper_scope_p;
          l2_eval_expr_lshift_rshift_rshift_unsigned1
                    (__return_storage_ptr__,scope_p,left_expr_info_00);
          return __return_storage_ptr__;
        }
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          pcVar4 = ">>";
LAB_00108c46:
          pcVar5 = "integer";
LAB_00108c81:
          pcVar6 = "real";
          goto LAB_00108ca2;
        }
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          pcVar4 = ">>";
LAB_00108b7a:
          pcVar5 = "integer";
          goto LAB_00108c98;
        }
      }
      else {
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
            pcVar4 = ">>";
LAB_00108c91:
            pcVar5 = "real";
LAB_00108c98:
            pcVar6 = "bool";
            goto LAB_00108ca2;
          }
          if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
            pcVar4 = ">>";
LAB_00108cb0:
            pcVar5 = "real";
            pcVar6 = pcVar5;
            goto LAB_00108ca2;
          }
          if (new_left_expr_info.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_00108b8e;
          pcVar4 = ">>";
LAB_00108c27:
          pcVar5 = "real";
LAB_00108c2e:
          pcVar6 = "integer";
LAB_00108ca2:
          new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
          l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,lines,cols
                           ,pcVar4,pcVar5,pcVar6);
        }
        if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          lines = plVar3->current_line;
          cols = plVar3->current_col;
          if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
            pcVar4 = ">>";
            goto LAB_00108cc0;
          }
          if (new_left_expr_info.val_type != L2_EXPR_VAL_TYPE_REAL) {
            if (new_left_expr_info.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_00108b8e;
            pcVar4 = ">>";
            goto LAB_00108b51;
          }
          pcVar4 = ">>";
LAB_00108c7a:
          pcVar5 = "bool";
          goto LAB_00108c81;
        }
      }
    }
  }
  else {
    l2_parse_token_forward();
    plVar3 = l2_parse_token_current();
    l2_eval_expr_plus_sub(&new_left_expr_info,scope_p);
    if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
      if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_INTEGER) {
        new_left_expr_info.val.integer = lVar1 << (new_left_expr_info.val.bool & 0x3fU);
        goto LAB_001089c6;
      }
      if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        pcVar4 = "<<";
        goto LAB_00108c46;
      }
      if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        pcVar4 = "<<";
        goto LAB_00108b7a;
      }
    }
    else {
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          pcVar4 = "<<";
          goto LAB_00108c91;
        }
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
          pcVar4 = "<<";
          goto LAB_00108cb0;
        }
        if (new_left_expr_info.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_00108b8e;
        pcVar4 = "<<";
        goto LAB_00108c27;
      }
      if (left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
        lines = plVar3->current_line;
        cols = plVar3->current_col;
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_BOOL) {
          pcVar4 = "<<";
          goto LAB_00108cc0;
        }
        if (new_left_expr_info.val_type == L2_EXPR_VAL_TYPE_REAL) {
          pcVar4 = "<<";
          goto LAB_00108c7a;
        }
        if (new_left_expr_info.val_type != L2_EXPR_VAL_TYPE_INTEGER) goto LAB_00108b8e;
        pcVar4 = "<<";
LAB_00108b51:
        pcVar5 = "bool";
        goto LAB_00108c2e;
      }
    }
  }
  lines = plVar3->current_line;
  cols = plVar3->current_col;
LAB_00108b8e:
  new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
  l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,lines,cols);
}

Assistant:

l2_expr_info l2_eval_expr_lshift_rshift_rshift_unsigned1(l2_scope *scope_p, l2_expr_info left_expr_info) {
    l2_expr_info right_expr_info, new_left_expr_info;
    _declr_current_token_p

    _if_type (L2_TOKEN_LSHIFT) /* << */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_plus_sub(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.integer = (left_expr_info.val.integer << right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "integer", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "real", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "<<", "real", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _elif_type (L2_TOKEN_RSHIFT) /* >> */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_plus_sub(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.integer = (left_expr_info.val.integer >> right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "integer", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "real", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>", "real", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _elif_type (L2_TOKEN_RSHIFT_UNSIGNED) /* >>> */
    {
        _get_current_token_p
        right_expr_info = l2_eval_expr_plus_sub(scope_p);
        new_left_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        switch (left_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        new_left_expr_info.val.integer = (((unsigned int)left_expr_info.val.integer) >> right_expr_info.val.integer);
                        break;

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "integer", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "integer", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "bool", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "bool", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "bool", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                switch (right_expr_info.val_type) {
                    case L2_EXPR_VAL_TYPE_INTEGER:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "real", "integer");

                    case L2_EXPR_VAL_TYPE_BOOL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "real", "bool");

                    case L2_EXPR_VAL_TYPE_REAL:
                        l2_parsing_error(L2_PARSING_ERROR_DUALISTIC_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, ">>>", "real", "real");

                    default:
                        l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
                }
                break;

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return l2_eval_expr_lshift_rshift_rshift_unsigned1(scope_p, new_left_expr_info);

    }
    _else
    {
        return left_expr_info;
    }
}